

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

sftp_zombie_requests * find_zombie_request(LIBSSH2_SFTP *sftp,uint32_t request_id)

{
  sftp_zombie_requests *node;
  
  node = (sftp_zombie_requests *)_libssh2_list_first(&sftp->zombie_requests);
  while( true ) {
    if (node == (sftp_zombie_requests *)0x0) {
      return (sftp_zombie_requests *)0x0;
    }
    if (node->request_id == request_id) break;
    node = (sftp_zombie_requests *)_libssh2_list_next(&node->node);
  }
  return node;
}

Assistant:

static struct sftp_zombie_requests *
find_zombie_request(LIBSSH2_SFTP *sftp, uint32_t request_id)
{
    struct sftp_zombie_requests *zombie =
        _libssh2_list_first(&sftp->zombie_requests);

    while(zombie) {
        if(zombie->request_id == request_id)
            break;
        else
            zombie = _libssh2_list_next(&zombie->node);
    }

    return zombie;
}